

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O2

int32_t per_get_few_bits(asn_per_data_t *pd,int nbits)

{
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar9;
  int nbits_00;
  long lVar10;
  asn_per_data_t local_68;
  ulong uVar8;
  
  uVar8 = (ulong)(uint)nbits;
  uVar9 = 0;
  uVar3 = 0xffffffff;
LAB_0014a563:
  uVar7 = (uint)uVar8;
  if ((int)uVar7 < 0) {
LAB_0014a6b6:
    return uVar3 | uVar9;
  }
  uVar4 = pd->nboff;
  lVar10 = pd->nbits - uVar4;
  if (lVar10 < (long)uVar8) {
    if ((0x1f < uVar7) || (pd->refill == (_func_int_asn_per_data_s_ptr *)0x0)) goto LAB_0014a6b6;
    nbits_00 = (int)lVar10;
    iVar1 = per_get_few_bits(pd,nbits_00);
    if (iVar1 < 0) goto LAB_0014a6b6;
    iVar2 = (*pd->refill)(pd);
    if (iVar2 != 0) goto LAB_0014a6b6;
    uVar7 = uVar7 - nbits_00;
    uVar8 = (ulong)uVar7;
    uVar9 = uVar9 | iVar1 << ((byte)uVar7 & 0x1f);
    goto LAB_0014a563;
  }
  puVar6 = (uint *)pd->buffer;
  if (7 < uVar4) {
    puVar6 = (uint *)((long)puVar6 + (uVar4 >> 3));
    pd->buffer = (uint8_t *)puVar6;
    pd->nbits = pd->nbits - (uVar4 & 0xfffffffffffffff8);
    uVar4 = (ulong)((uint)uVar4 & 7);
  }
  pd->moved = pd->moved + uVar8;
  uVar4 = uVar4 + uVar8;
  pd->nboff = uVar4;
  if (uVar4 < 9) {
    if (uVar7 != 0) {
      uVar3 = (uint)(byte)*puVar6;
      cVar5 = '\b';
      goto LAB_0014a63a;
    }
    uVar3 = 0;
  }
  else {
    if (uVar4 < 0x11) {
      uVar3 = (uint)(ushort)((ushort)*puVar6 << 8 | (ushort)*puVar6 >> 8);
      cVar5 = '\x10';
    }
    else {
      if (0x18 < uVar4) {
        if (uVar4 < 0x20) {
          uVar3 = *puVar6;
          uVar3 = (int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18) >> (-(char)uVar4 & 0x1fU);
          goto LAB_0014a6ab;
        }
        if (0x1f < uVar7) {
          per_get_undo(pd,uVar7);
          goto LAB_0014a6b6;
        }
        local_68.buffer = pd->buffer;
        local_68.nboff = pd->nboff;
        local_68.nbits = pd->nbits;
        local_68.moved = pd->moved;
        local_68.refill = pd->refill;
        local_68.refill_key = pd->refill_key;
        if ((long)uVar8 <= (long)local_68.nboff) {
          local_68.moved = local_68.moved - uVar8;
          local_68.nboff = local_68.nboff - uVar8;
        }
        iVar1 = per_get_few_bits(&local_68,uVar7 - 0x18);
        uVar3 = per_get_few_bits(&local_68,0x18);
        uVar3 = uVar3 | iVar1 << 0x18;
        goto LAB_0014a6ab;
      }
      uVar3 = (uint)*(byte *)((long)puVar6 + 2) |
              (uint)*(byte *)((long)puVar6 + 1) << 8 | (uint)(byte)*puVar6 << 0x10;
      cVar5 = '\x18';
    }
LAB_0014a63a:
    uVar3 = uVar3 >> (cVar5 - (char)uVar4 & 0x1fU);
  }
LAB_0014a6ab:
  uVar3 = ~(-1 << ((byte)uVar8 & 0x1f)) & uVar3;
  goto LAB_0014a6b6;
}

Assistant:

int32_t
per_get_few_bits(asn_per_data_t *pd, int nbits) {
	size_t off;	/* Next after last bit offset */
	ssize_t nleft;	/* Number of bits left in this stream */
	uint32_t accum;
	const uint8_t *buf;

	if(nbits < 0)
		return -1;

	nleft = pd->nbits - pd->nboff;
	if(nbits > nleft) {
		int32_t tailv, vhead;
		if(!pd->refill || nbits > 31) return -1;
		/* Accumulate unused bytes before refill */
		ASN_DEBUG("Obtain the rest %d bits (want %d)",
			(int)nleft, (int)nbits);
		tailv = per_get_few_bits(pd, nleft);
		if(tailv < 0) return -1;
		/* Refill (replace pd contents with new data) */
		if(pd->refill(pd))
			return -1;
		nbits -= nleft;
		vhead = per_get_few_bits(pd, nbits);
		/* Combine the rest of previous pd with the head of new one */
		tailv = (tailv << nbits) | vhead;  /* Could == -1 */
		return tailv;
	}

	/*
	 * Normalize position indicator.
	 */
	if(pd->nboff >= 8) {
		pd->buffer += (pd->nboff >> 3);
		pd->nbits  -= (pd->nboff & ~0x07);
		pd->nboff  &= 0x07;
	}
	pd->moved += nbits;
	pd->nboff += nbits;
	off = pd->nboff;
	buf = pd->buffer;

	/*
	 * Extract specified number of bits.
	 */
	if(off <= 8)
		accum = nbits ? (buf[0]) >> (8 - off) : 0;
	else if(off <= 16)
		accum = ((buf[0] << 8) + buf[1]) >> (16 - off);
	else if(off <= 24)
		accum = ((buf[0] << 16) + (buf[1] << 8) + buf[2]) >> (24 - off);
	else if(off <= 31)
		accum = ((buf[0] << 24) + (buf[1] << 16)
			+ (buf[2] << 8) + (buf[3])) >> (32 - off);
	else if(nbits <= 31) {
		asn_per_data_t tpd = *pd;
		/* Here are we with our 31-bits limit plus 1..7 bits offset. */
		per_get_undo(&tpd, nbits);
		/* The number of available bits in the stream allow
		 * for the following operations to take place without
		 * invoking the ->refill() function */
		accum  = per_get_few_bits(&tpd, nbits - 24) << 24;
		accum |= per_get_few_bits(&tpd, 24);
	} else {
		per_get_undo(pd, nbits);
		return -1;
	}

	accum &= (((uint32_t)1 << nbits) - 1);

	ASN_DEBUG("  [PER got %2d<=%2d bits => span %d %+ld[%d..%d]:%02x (%d) => 0x%x]",
		(int)nbits, (int)nleft,
		(int)pd->moved,
		(((long)pd->buffer) & 0xf),
		(int)pd->nboff, (int)pd->nbits,
		((pd->buffer != NULL)?pd->buffer[0]:0),
		(int)(pd->nbits - pd->nboff),
		(int)accum);

	return accum;
}